

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc_re.c
# Opt level: O3

int alloc_re(char **x,uint m,uint n)

{
  char *to;
  
  to = alloc(n);
  if (to != (char *)0x0) {
    byte_copy(to,m,*x);
    alloc_free(*x);
    *x = to;
  }
  return (uint)(to != (char *)0x0);
}

Assistant:

int alloc_re(x,m,n)
char **x;
unsigned int m;
unsigned int n;
{
  char *y;
 
  y = alloc(n);
  if (!y) return 0;
  byte_copy(y,m,*x);
  alloc_free(*x);
  *x = y;
  return 1;
}